

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.cpp
# Opt level: O0

void __thiscall
CChromeTracer::writeDeviceTiming
          (CChromeTracer *this,char *name,uint64_t startTime,uint64_t endTime,uint64_t id)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined4 uVar4;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  int size;
  int size_1;
  
  uVar4 = (undefined4)((ulong)in_RDX >> 0x20);
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    auVar2._8_4_ = uVar4;
    auVar2._0_8_ = in_RDX;
    auVar2._12_4_ = 0x45300000;
    snprintf((char *)(in_RDI + 0x240),0x4000,
             "{\"ph\":\"f\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"Command\",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%lu},\n"
             ,((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)) / 1000.0,
             *(undefined8 *)(in_RDI + 0x30),in_RSI,in_R8);
    std::ostream::write((char *)(in_RDI + 0x40),in_RDI + 0x240);
  }
  auVar3._8_4_ = uVar4;
  auVar3._0_8_ = in_RDX;
  auVar3._12_4_ = 0x45300000;
  lVar1 = in_RCX - in_RDX;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  snprintf((char *)(in_RDI + 0x240),0x4000,
           "{\"ph\":\"X\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"%s\",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%lu}},\n"
           ,((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)) / 1000.0,
           ((auVar5._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0,
           *(undefined8 *)(in_RDI + 0x30),in_RSI,in_RSI,in_R8);
  std::ostream::write((char *)(in_RDI + 0x40),in_RDI + 0x240);
  return;
}

Assistant:

void CChromeTracer::writeDeviceTiming(
    const char* name,
    uint64_t startTime,
    uint64_t endTime,
    uint64_t id )
{
    if( m_AddFlowEvents )
    {
        int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
            "{\"ph\":\"f\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"Command\""
            ",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%" PRIu64 "},\n",
            m_ProcessId,
            name,
            startTime / 1000.0,
            id );
        m_TraceFile.write(m_StringBuffer, size);
    }

    int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
        "{\"ph\":\"X\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"%s\""
        ",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%" PRIu64 "}},\n",
        m_ProcessId,
        name,
        name,
        startTime / 1000.0,
        (endTime - startTime) / 1000.0,
        id );
    m_TraceFile.write(m_StringBuffer, size);
}